

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>
* __thiscall
cs::
allocator_type<cs_impl::any::holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>,_64UL,_cs_impl::default_allocator_provider>
::alloc<>(allocator_type<cs_impl::any::holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>,_64UL,_cs_impl::default_allocator_provider>
          *this)

{
  slot_type *psVar1;
  __int_type_conflict _Var2;
  holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>
  *phVar3;
  holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>
  *in_RDI;
  new_allocator<cs_impl::any::holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>_>
  *unaff_retaddr;
  holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>
  *ptr;
  void *pvVar4;
  
  pvVar4 = (void *)0x0;
  phVar3 = in_RDI;
  if (in_RDI[9].mDat.
      super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
      .slots_ != (slot_type *)0x0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDI);
    if (_Var2 == 0) {
      psVar1 = in_RDI[9].mDat.
               super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
               .slots_;
      in_RDI[9].mDat.
      super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
      .slots_ = (slot_type *)((long)&psVar1[-1].mDat + 7);
      phVar3 = *(holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>
                 **)((long)in_RDI + (long)psVar1 * 8 + -8);
      goto LAB_0022a4fa;
    }
  }
  phVar3 = __gnu_cxx::
           new_allocator<cs_impl::any::holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>_>
           ::allocate(unaff_retaddr,(size_type)phVar3,pvVar4);
LAB_0022a4fa:
  __gnu_cxx::
  new_allocator<cs_impl::any::holder<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>>
  ::
  construct<cs_impl::any::holder<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>>
            ((new_allocator<cs_impl::any::holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>_>
              *)phVar3,in_RDI);
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}